

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,EndpointDeclaration *e)

{
  bool bVar1;
  EndpointDetails *pEVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  Expression *pEVar4;
  ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *this_00;
  PathSection *pPVar5;
  PathSection *p;
  PathSection *__end3_1;
  PathSection *__begin3_1;
  ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL> *__range3_1;
  pool_ref<soul::AST::Expression> *type;
  pool_ref<soul::AST::Expression> *__end3;
  pool_ref<soul::AST::Expression> *__begin3;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *__range3;
  EndpointDetails *details;
  EndpointDeclaration *e_local;
  ASTVisitor *this_local;
  
  pEVar2 = pool_ptr<soul::AST::EndpointDetails>::get(&e->details);
  if (pEVar2 != (EndpointDetails *)0x0) {
    __end3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::begin
                       (&pEVar2->dataTypes);
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::end
                       (&pEVar2->dataTypes);
    for (; __end3 != ppVar3; __end3 = __end3 + 1) {
      pEVar4 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end3);
      (*this->_vptr_ASTVisitor[3])(this,pEVar4);
    }
    visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&pEVar2->arraySize);
  }
  bVar1 = pool_ptr<soul::AST::ChildEndpointPath>::operator!=(&e->childPath,(void *)0x0);
  if (bVar1) {
    this_00 = &pool_ptr<soul::AST::ChildEndpointPath>::operator->(&e->childPath)->sections;
    __end3_1 = ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL>::begin
                         (this_00);
    pPVar5 = ArrayWithPreallocation<soul::AST::ChildEndpointPath::PathSection,_4UL>::end(this_00);
    for (; __end3_1 != pPVar5; __end3_1 = __end3_1 + 1) {
      visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&__end3_1->index);
    }
  }
  (*this->_vptr_ASTVisitor[0xb])(this,&e->annotation);
  return;
}

Assistant:

virtual void visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                visitObject (type);

            visitObjectIfNotNull (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                visitObjectIfNotNull (p.index);

        visit (e.annotation);
    }